

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O1

void __thiscall ArrayType::GenArrayLength(ArrayType *this,Output *out_cc,Env *env,DataPtr *data)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  Exception *this_00;
  ID *pIVar8;
  string max_elements_available;
  string local_70;
  string local_50;
  
  if (this->arraylength_var_field_ == (Field *)0x0) {
    pIVar8 = (ID *)0x0;
  }
  else {
    pIVar8 = this->arraylength_var_field_->id_;
  }
  bVar2 = Env::Evaluated(env,pIVar8);
  if (!bVar2) {
    if ((this->super_Type).incremental_parsing_ == false) {
      (*(this->arraylength_var_field_->super_DataDepElement)._vptr_DataDepElement[7])
                (this->arraylength_var_field_,out_cc,env);
      if ((this->length_ == (Expr *)0x0) && ((this->super_Type).attr_restofdata_ == false)) {
        (*(this->arraylength_var_field_->super_DataDepElement)._vptr_DataDepElement[8])
                  (this->arraylength_var_field_,out_cc,env);
      }
    }
    if (this->length_ == (Expr *)0x0) {
      if ((this->super_Type).attr_restofdata_ == true) {
        if (this->arraylength_var_field_ == (Field *)0x0) {
          pIVar8 = (ID *)0x0;
        }
        else {
          pIVar8 = this->arraylength_var_field_->id_;
        }
        pcVar5 = Env::LValue(env,pIVar8);
        pcVar6 = Env::RValue(env,end_of_data);
        pIVar8 = (ID *)0x0;
        Output::println(out_cc,"%s = (%s) - (%s);",pcVar5,pcVar6,(data->ptr_expr_)._M_dataplus._M_p)
        ;
        if (this->arraylength_var_field_ != (Field *)0x0) {
          pIVar8 = this->arraylength_var_field_->id_;
        }
        Env::SetEvaluated(env,pIVar8,true);
        return;
      }
    }
    else {
      if (this->arraylength_var_field_ == (Field *)0x0) {
        pIVar8 = (ID *)0x0;
      }
      else {
        pIVar8 = this->arraylength_var_field_->id_;
      }
      pcVar5 = Env::LValue(env,pIVar8);
      pcVar6 = Expr::EvalExpr(this->length_,out_cc,env);
      pIVar8 = (ID *)0x0;
      Output::println(out_cc,"%s = %s;",pcVar5,pcVar6);
      if (this->arraylength_var_field_ != (Field *)0x0) {
        pIVar8 = this->arraylength_var_field_->id_;
      }
      Env::SetEvaluated(env,pIVar8,true);
      if (this->arraylength_var_field_ == (Field *)0x0) {
        pIVar8 = (ID *)0x0;
      }
      else {
        pIVar8 = this->arraylength_var_field_->id_;
      }
      pcVar5 = Env::LValue(env,pIVar8);
      pIVar8 = (ID *)0x0;
      Output::println(out_cc,"if ( %s < 0 )",pcVar5);
      out_cc->indent_ = out_cc->indent_ + 1;
      Output::println(out_cc,"{");
      Output::println(out_cc,"throw binpac::ExceptionOutOfBound(\"%s\",",
                      (this->super_Type).data_id_str_._M_dataplus._M_p);
      if (this->arraylength_var_field_ != (Field *)0x0) {
        pIVar8 = this->arraylength_var_field_->id_;
      }
      pcVar5 = Env::LValue(env,pIVar8);
      pcVar6 = Env::RValue(env,end_of_data);
      pcVar7 = Env::RValue(env,begin_of_data);
      Output::println(out_cc,"  %s, (%s) - (%s));",pcVar5,pcVar6,pcVar7);
      Output::println(out_cc,"}");
      out_cc->indent_ = out_cc->indent_ + -1;
      iVar3 = (*(this->elemtype_->super_DataDepElement)._vptr_DataDepElement[0x13])
                        (this->elemtype_,env);
      pcVar1 = (this->super_Type).data_id_str_._M_dataplus._M_p;
      if (iVar3 == -1) {
        Output::println(out_cc,"// Check array element quantity: %s",pcVar1);
        uVar4 = 1;
      }
      else {
        Output::println(out_cc,"// Check bounds for static-size array: %s",pcVar1);
        (*(this->elemtype_->super_DataDepElement)._vptr_DataDepElement[0x14])();
        uVar4 = (*(this->elemtype_->super_DataDepElement)._vptr_DataDepElement[0x13])
                          (this->elemtype_,env);
        if (uVar4 == 0) {
          this_00 = (Exception *)__cxa_allocate_exception(0x20);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "using an array of known-to-be-empty elements is possibly a bad idea","");
          Exception::Exception(this_00,&(this->super_Type).super_Object,&local_50);
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
      }
      pcVar1 = (data->ptr_expr_)._M_dataplus._M_p;
      pcVar5 = Env::RValue(env,end_of_data);
      pIVar8 = (ID *)0x0;
      strfmt_abi_cxx11_(&local_70,"((%s - %s) / %d)",pcVar5,pcVar1,(ulong)uVar4);
      if (this->arraylength_var_field_ != (Field *)0x0) {
        pIVar8 = this->arraylength_var_field_->id_;
      }
      pcVar5 = Env::RValue(env,pIVar8);
      Output::println(out_cc,"if ( %s > %s )",pcVar5,local_70._M_dataplus._M_p);
      out_cc->indent_ = out_cc->indent_ + 1;
      Output::println(out_cc,"throw binpac::ExceptionOutOfBound(\"%s\",",
                      (this->super_Type).data_id_str_._M_dataplus._M_p);
      if (this->arraylength_var_field_ == (Field *)0x0) {
        pIVar8 = (ID *)0x0;
      }
      else {
        pIVar8 = this->arraylength_var_field_->id_;
      }
      pcVar5 = Env::RValue(env,pIVar8);
      pcVar6 = Env::RValue(env,end_of_data);
      Output::println(out_cc,"  %s, (%s) - (%s));",pcVar5,pcVar6,pcVar1);
      out_cc->indent_ = out_cc->indent_ + -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void ArrayType::GenArrayLength(Output* out_cc, Env* env, const DataPtr& data)
	{
	if ( env->Evaluated(arraylength_var()) )
		return;

	if ( ! incremental_parsing() )
		{
		arraylength_var_field_->GenTempDecls(out_cc, env);
		// This is about to get initialized below, don't initialize it twice.
		if ( ! length_ && ! attr_restofdata_ )
			arraylength_var_field_->GenInitCode(out_cc, env);
		}

	if ( length_ )
		{
		out_cc->println("%s = %s;", env->LValue(arraylength_var()), length_->EvalExpr(out_cc, env));

		env->SetEvaluated(arraylength_var());

		// Check negative array length
		out_cc->println("if ( %s < 0 )", env->LValue(arraylength_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		out_cc->println("throw binpac::ExceptionOutOfBound(\"%s\",", data_id_str_.c_str());
		out_cc->println("  %s, (%s) - (%s));", env->LValue(arraylength_var()),
		                env->RValue(end_of_data), env->RValue(begin_of_data));
		out_cc->println("}");
		out_cc->dec_indent();

		int element_size;

		if ( elemtype_->StaticSize(env) == -1 )
			{
			// Check for overlong array quantity.  We cap it at the maximum
			// array size (assume 1-byte elements * array length) as we can't
			// possibly store more elements.  e.g. this helps prevent
			// user-controlled length fields from causing an excessive
			// iteration and/or memory-allocation (for the array we'll be
			// parsing into) unless they actually sent enough data to go along
			// with it.  Note that this check is *not* looking for whether the
			// contents of the array will extend past the end of the data
			// buffer.
			out_cc->println("// Check array element quantity: %s", data_id_str_.c_str());
			element_size = 1;
			}
		else
			{
			// Boundary check the entire array if elements have static size.
			out_cc->println("// Check bounds for static-size array: %s", data_id_str_.c_str());
			elemtype_->SetBoundaryChecked();
			element_size = elemtype_->StaticSize(env);

			if ( element_size == 0 )
				{
				// If we know we have an array of empty elements, probably
				// better to structure the parser as just a single empty
				// field to avoid DoS vulnerability of allocating
				// arbitrary number of empty records (i.e. cheap for them,
				// but costly for us unless we have special optimization
				// for this scenario to forgo the usual allocation).
				throw Exception(
					this, "using an array of known-to-be-empty elements is possibly a bad idea");
				}
			}

		const char* array_ptr_expr = data.ptr_expr();
		string max_elements_available = strfmt("((%s - %s) / %d)", env->RValue(end_of_data),
		                                       array_ptr_expr, element_size);

		out_cc->println("if ( %s > %s )", env->RValue(arraylength_var()),
		                max_elements_available.c_str());
		out_cc->inc_indent();
		out_cc->println("throw binpac::ExceptionOutOfBound(\"%s\",", data_id_str_.c_str());
		out_cc->println("  %s, (%s) - (%s));", env->RValue(arraylength_var()),
		                env->RValue(end_of_data), array_ptr_expr);
		out_cc->dec_indent();
		}
	else if ( attr_restofdata_ )
		{
		ASSERT(elemtype_->StaticSize(env) == 1);
		out_cc->println("%s = (%s) - (%s);", env->LValue(arraylength_var()),
		                env->RValue(end_of_data), data.ptr_expr());
		env->SetEvaluated(arraylength_var());
		}
	}